

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  TRef TVar1;
  IRIns *ir;
  
  ir = T->ir + ref;
  if (ref < 0x8000) {
    TVar1 = snap_replay_const(J,ir);
    return TVar1;
  }
  if (((ir->field_0).prev & 0xff80) == 0x80) {
    return 0;
  }
  if (((seen >> ((ulong)ref & 0x3f) & 1) != 0) && (TVar1 = snap_dedup(J,map,nmax,ref), TVar1 != 0))
  {
    return TVar1;
  }
  (J->fold).ins.field_0.ot = (ir->field_1).t.irt & 0x1f | 0xe00;
  (J->fold).ins.field_0.op1 = (ushort)ref ^ 0x8000;
  (J->fold).ins.field_0.op2 = 0;
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}